

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrecurse.c
# Opt level: O0

int runtest(int i)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int old_leaks;
  int old_tests;
  int old_errors;
  int res;
  int ret;
  int i_local;
  
  iVar3 = nb_tests;
  iVar2 = nb_leaks;
  iVar1 = nb_errors;
  if ((tests_quiet == 0) && (testDescriptions[i].desc != (char *)0x0)) {
    printf("## %s\n",testDescriptions[i].desc);
  }
  iVar4 = launchTests(testDescriptions + i);
  old_errors = (int)(iVar4 != 0);
  if (verbose != 0) {
    if ((nb_errors == iVar1) && (nb_leaks == iVar2)) {
      printf("Ran %d tests, no errors\n",(ulong)(uint)(nb_tests - iVar3));
    }
    else {
      printf("Ran %d tests, %d errors, %d leaks\n",(ulong)(uint)(nb_tests - iVar3),
             (ulong)(uint)(nb_errors - iVar1),(ulong)(uint)(nb_leaks - iVar2));
    }
  }
  return old_errors;
}

Assistant:

static int
runtest(int i) {
    int ret = 0, res;
    int old_errors, old_tests, old_leaks;

    old_errors = nb_errors;
    old_tests = nb_tests;
    old_leaks = nb_leaks;
    if ((tests_quiet == 0) && (testDescriptions[i].desc != NULL))
	printf("## %s\n", testDescriptions[i].desc);
    res = launchTests(&testDescriptions[i]);
    if (res != 0)
	ret++;
    if (verbose) {
	if ((nb_errors == old_errors) && (nb_leaks == old_leaks))
	    printf("Ran %d tests, no errors\n", nb_tests - old_tests);
	else
	    printf("Ran %d tests, %d errors, %d leaks\n",
		   nb_tests - old_tests,
		   nb_errors - old_errors,
		   nb_leaks - old_leaks);
    }
    return(ret);
}